

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

bool Assimp::Ogre::OgreBinarySerializer::ImportSkeleton(IOSystem *pIOHandler,Mesh *mesh)

{
  bool bVar1;
  ulong uVar2;
  string *s;
  Skeleton *this;
  element_type *reader_00;
  undefined1 local_90 [8];
  OgreBinarySerializer serializer;
  Skeleton *skeleton;
  undefined1 local_68 [8];
  MemoryStreamReaderPtr reader;
  allocator local_41;
  string local_40;
  Mesh *local_20;
  Mesh *mesh_local;
  IOSystem *pIOHandler_local;
  
  if ((mesh == (Mesh *)0x0) ||
     (local_20 = mesh, mesh_local = (Mesh *)pIOHandler, uVar2 = std::__cxx11::string::empty(),
     (uVar2 & 1) != 0)) {
    pIOHandler_local._7_1_ = 0;
  }
  else {
    s = &local_20->skeletonRef;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,".skeleton.xml",&local_41);
    bVar1 = EndsWith(s,&local_40,false);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (bVar1) {
      OgreXmlSerializer::ImportSkeleton((IOSystem *)mesh_local,local_20);
      pIOHandler_local._7_1_ = 0;
    }
    else {
      OpenReader((OgreBinarySerializer *)local_68,(IOSystem *)mesh_local,&local_20->skeletonRef);
      pIOHandler_local._7_1_ = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
      if ((bool)pIOHandler_local._7_1_) {
        this = (Skeleton *)operator_new(0x38);
        Skeleton::Skeleton(this);
        serializer._16_8_ = this;
        reader_00 = std::
                    __shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>::
                    get((__shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>
                         *)local_68);
        OgreBinarySerializer((OgreBinarySerializer *)local_90,reader_00,AM_Skeleton);
        ReadSkeleton((OgreBinarySerializer *)local_90,(Skeleton *)serializer._16_8_);
        local_20->skeleton = (Skeleton *)serializer._16_8_;
      }
      std::shared_ptr<Assimp::StreamReader<false,_false>_>::~shared_ptr
                ((shared_ptr<Assimp::StreamReader<false,_false>_> *)local_68);
    }
  }
  return (bool)(pIOHandler_local._7_1_ & 1);
}

Assistant:

bool OgreBinarySerializer::ImportSkeleton(Assimp::IOSystem *pIOHandler, Mesh *mesh)
{
    if (!mesh || mesh->skeletonRef.empty())
        return false;

    // Highly unusual to see in read world cases but support
    // binary mesh referencing a XML skeleton file.
    if (EndsWith(mesh->skeletonRef, ".skeleton.xml", false))
    {
        OgreXmlSerializer::ImportSkeleton(pIOHandler, mesh);
        return false;
    }

    MemoryStreamReaderPtr reader = OpenReader(pIOHandler, mesh->skeletonRef);
    if (!reader)
      return false;

    Skeleton *skeleton = new Skeleton();
    OgreBinarySerializer serializer(reader.get(), OgreBinarySerializer::AM_Skeleton);
    serializer.ReadSkeleton(skeleton);
    mesh->skeleton = skeleton;
    return true;
}